

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

void __thiscall Table_NumericKey_Test::Table_NumericKey_Test(Table_NumericKey_Test *this)

{
  Table_NumericKey_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Table_NumericKey_Test_0022be70;
  return;
}

Assistant:

TEST(Table, NumericKey) {
    std::istringstream input("[123]");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::table, {"123"}},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}